

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::CallForAllHelp::CallForAllHelp(CallForAllHelp *this,string *msg,ExitCodes exit_code)

{
  undefined4 in_EDX;
  Success *in_RSI;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39 [21];
  ExitCodes in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff90;
  ::std::__cxx11::string::string
            (in_stack_ffffffffffffffb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa8);
  Success::Success(in_RSI,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator(local_39);
  *in_RDI = &PTR__CallForAllHelp_00922eb0;
  return;
}

Assistant:

CallForAllHelp()
        : CallForAllHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}